

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void ScanFile(ConfigScanner *sc)

{
  char cVar1;
  byte bVar2;
  ValueType VVar3;
  char *pcVar4;
  SectionList *pSVar5;
  byte *pbVar6;
  ConfigItem *pCVar8;
  SectionList *pSVar9;
  ItemValue IVar10;
  ConfigItem *pCVar11;
  byte *pbVar7;
  
  if (g_verbose) {
    ScanFile_cold_1();
  }
  if (sc != (ConfigScanner *)0x0) {
    pcVar4 = sc->base;
    sc->ptr = pcVar4;
    sc->current_section_name = (char *)0x0;
    if (*pcVar4 != '\0') {
LAB_00142af6:
      sc->vtype = VTYPE_NONE;
      sc->current_key = (char *)0x0;
      while( true ) {
        cVar1 = *pcVar4;
        if ((cVar1 != '\t') && (cVar1 != ' ')) break;
        sc->ptr = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
      }
      if (cVar1 == '[') {
        pcVar4 = ScanSection(sc);
        if (pcVar4 != (char *)0x0) {
          if (g_verbose == true) {
            fprintf(_stderr,anon_var_dwarf_5c0,pcVar4);
          }
          pSVar5 = (SectionList *)malloc(0x10);
          pSVar5->name = pcVar4;
          pSVar5->succ = (SectionList_t *)0x0;
          pSVar9 = (SectionList *)&sc->first_section;
          if (sc->first_section != (SectionList *)0x0) {
            pSVar9 = sc->current_section;
          }
          pSVar9->succ = pSVar5;
          sc->current_section = pSVar5;
        }
      }
      else {
        ScanPair(sc);
      }
      pbVar7 = (byte *)sc->ptr;
      do {
        pbVar6 = pbVar7 + 1;
        bVar2 = *pbVar7;
        if (bVar2 < 0xd) {
          if (bVar2 != 9) {
            if (bVar2 == 0) goto LAB_00142bd3;
            if (bVar2 != 10) {
              return;
            }
            goto LAB_00142bcf;
          }
        }
        else {
          if (0x22 < bVar2) {
            if ((bVar2 != 0x23) && (bVar2 != 0x3b)) {
              return;
            }
            SkipLine(sc);
            goto LAB_00142bd3;
          }
          if (bVar2 != 0x20) goto LAB_00142bba;
        }
        sc->ptr = (char *)pbVar6;
        pbVar7 = pbVar6;
      } while( true );
    }
  }
  return;
LAB_00142bba:
  if (bVar2 != 0xd) {
    return;
  }
  sc->ptr = (char *)pbVar6;
  if (*pbVar6 == 10) {
    pbVar6 = pbVar7 + 2;
LAB_00142bcf:
    sc->ptr = (char *)pbVar6;
  }
LAB_00142bd3:
  pcVar4 = sc->current_key;
  if (pcVar4 == (char *)0x0) goto LAB_00142c43;
  pCVar8 = (ConfigItem *)malloc(0x28);
  pCVar8->key = pcVar4;
  VVar3 = sc->vtype;
  pCVar8->vtype = VVar3;
  pCVar8->section = sc->current_section;
  pCVar8->succ = (ConfigItem_t *)0x0;
  switch(VVar3) {
  case VTYPE_STRING:
    IVar10 = (ItemValue)sc->current_string;
    goto LAB_00142c19;
  case VTYPE_BOOLEAN:
    (pCVar8->value).v_boolean = sc->current_boolean;
    break;
  case VTYPE_INTEGER:
    IVar10 = (ItemValue)sc->current_integer;
LAB_00142c19:
    pCVar8->value = IVar10;
    break;
  case VTYPE_DOUBLE:
    pCVar8->value = (ItemValue)sc->current_double;
  }
  pCVar11 = sc->current_item;
  if (sc->current_item == (ConfigItem *)0x0) {
    pCVar11 = (ConfigItem *)&sc->first_item;
  }
  pCVar11->succ = pCVar8;
  sc->current_item = pCVar8;
LAB_00142c43:
  pcVar4 = sc->ptr;
  if (*pcVar4 == '\0') {
    return;
  }
  goto LAB_00142af6;
}

Assistant:

void ScanFile(ConfigScanner *sc)
{
	if (g_verbose)
	{
		console_message(u8"設定解析開始\n");
	}

	if (sc == NULL)
	{
		return;
	}
	sc->ptr = sc->base;
	sc->current_section_name = NULL;
	while (*sc->ptr != '\0')
	{
		sc->vtype = VTYPE_NONE;
		sc->current_key = NULL;
		SkipSpace(sc);
		if (isSectionTop(sc))
		{
			char *section = ScanSection(sc);
			if (section)
			{
				if (g_verbose)
				{
					console_message_string(u8"config section： %s\n", section);
				}
				SectionList *sec = (SectionList *)malloc(sizeof(SectionList));
				sec->name = section;
				sec->succ = NULL;
				if (!sc->first_section)
				{
					sc->first_section = sec;
				}
				else
				{
					sc->current_section->succ = sec;
				}
				sc->current_section = sec;
			}
		}
		else
		{
			ScanPair(sc);
		}
		SkipSpace(sc);
		if (isBeginningComment(sc))
		{
			SkipLine(sc);
		}
		else if (!ScanEol(sc))
		{
			break;
		}

		if (sc->current_key != NULL)
		{
			ConfigItem *temp = (ConfigItem *)malloc(sizeof(ConfigItem));
			temp->key = sc->current_key;
			temp->vtype = sc->vtype;
			temp->section = sc->current_section;
			temp->succ = NULL;
			switch (temp->vtype)
			{
			case VTYPE_NONE:
				break;
			case VTYPE_STRING:
				temp->value.v_string = sc->current_string;
				break;
			case VTYPE_BOOLEAN:
				temp->value.v_boolean = sc->current_boolean;
				break;
			case VTYPE_INTEGER:
				temp->value.v_integer = sc->current_integer;
				break;
			case VTYPE_DOUBLE:
				temp->value.v_double = sc->current_double;
				break;
			}

			if (!sc->current_item)
			{
				sc->first_item = temp;
			}
			else
			{
				sc->current_item->succ = temp;
			}
			sc->current_item = temp;
		}
	}
}